

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

llhttp_errno_t llhttp_finish(llhttp_t *parser)

{
  uint8_t uVar1;
  code *pcVar2;
  llhttp_errno_t lVar3;
  
  if ((parser->error == 0) && (uVar1 = parser->finish, uVar1 != '\0')) {
    if (uVar1 == '\x02') {
      parser->reason = "Invalid EOF state";
      return HPE_INVALID_EOF_STATE;
    }
    if (uVar1 != '\x01') {
      abort();
    }
    if (((parser->settings != (void *)0x0) &&
        (pcVar2 = *(code **)((long)parser->settings + 0x58), pcVar2 != (code *)0x0)) &&
       (lVar3 = (*pcVar2)(), lVar3 != HPE_OK)) {
      return lVar3;
    }
  }
  return HPE_OK;
}

Assistant:

llhttp_errno_t llhttp_finish(llhttp_t* parser) {
  int err;

  /* We're in an error state. Don't bother doing anything. */
  if (parser->error != 0) {
    return 0;
  }

  switch (parser->finish) {
    case HTTP_FINISH_SAFE_WITH_CB:
      CALLBACK_MAYBE(parser, on_message_complete);
      if (err != HPE_OK) return err;

    /* FALLTHROUGH */
    case HTTP_FINISH_SAFE:
      return HPE_OK;
    case HTTP_FINISH_UNSAFE:
      parser->reason = "Invalid EOF state";
      return HPE_INVALID_EOF_STATE;
    default:
      abort();
  }
}